

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O3

bool Js::JavascriptOperators::CheckIfObjectAndPrototypeChainHasOnlyWritableDataProperties
               (RecyclableObject *object)

{
  JavascriptLibrary *pJVar1;
  bool bVar2;
  PrototypeChainCache<Js::OnlyWritablePropertyCache> *local_28;
  
  pJVar1 = (((object->type).ptr)->javascriptLibrary).ptr;
  Memory::Recycler::WBSetBit((char *)&local_28);
  local_28 = &pJVar1->typesWithOnlyWritablePropertyProtoChain;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_28);
  bVar2 = PrototypeChainCache<Js::OnlyWritablePropertyCache>::Check(local_28,object);
  return bVar2;
}

Assistant:

bool JavascriptOperators::CheckIfObjectAndPrototypeChainHasOnlyWritableDataProperties(_In_ RecyclableObject* object)
    {
        return object->GetLibrary()->GetTypesWithOnlyWritablePropertyProtoChainCache()->Check(object);
    }